

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

int Utils::getCountOfBytesBeforeNullTerminatorInt(const_iterator it)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  const_iterator itCopy;
  
  if (*it._M_current == 0) {
    return 3;
  }
  uVar3 = 0;
  do {
    if (it._M_current[uVar3 + 1] == 0) {
      uVar2 = uVar3 & 0xffffffff;
      break;
    }
    uVar2 = uVar3 + 1;
    lVar1 = uVar3 + 1;
    uVar3 = uVar2;
  } while (it._M_current[lVar1] != 0);
  return (int)uVar2 + 3;
}

Assistant:

int Utils::getCountOfBytesBeforeNullTerminatorInt(std::vector<unsigned int>::const_iterator it) {
    int countBytesBeforeNullTerminated = 0;
    auto itCopy = it;
    // Получаем сколько байт нужно считать до нультермитатора
    while ((int)*itCopy != 0x00 && (int)*(itCopy + 1) != 0x00 ) {
        ++countBytesBeforeNullTerminated;
        ++itCopy;
    }
    return countBytesBeforeNullTerminated + 3;
}